

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O2

void __thiscall
cuckoocache_tests::EraseTest::test_cache_erase<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseTest *this,size_t megabytes)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  double dVar4;
  uint256 e;
  uint256 e_00;
  pointer puVar5;
  readonly_property65 rVar6;
  bool bVar7;
  uint64_t uVar8;
  uint32_t i;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  iterator in_R8;
  iterator pvVar14;
  iterator in_R9;
  double *pdVar15;
  ulong uVar16;
  uint32_t i_1;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  check_type cVar26;
  assertion_result *paVar25;
  long local_210;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  double hit_rate_fresh;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  lazy_ostream local_168;
  undefined1 *local_158;
  char **local_150;
  assertion_result local_148;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  cache<uint256,_SignatureCacheHasher> set;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&set);
  uVar12 = megabytes << 0x14;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes(&set,uVar12);
  uVar9 = uVar12 >> 5;
  std::vector<uint256,_std::allocator<uint256>_>::resize(&hashes,uVar9 & 0xffffffff);
  uVar10 = uVar9 & 0xffffffff;
  lVar11 = 0;
  for (uVar19 = 0;
      puVar5 = hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start, uVar19 != uVar10; uVar19 = uVar19 + 1) {
    for (lVar17 = 0; (char)lVar17 != '\b'; lVar17 = lVar17 + 1) {
      uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                        (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>
                        );
      *(int *)((puVar5->super_base_blob<256U>).m_data._M_elems + lVar17 * 4 + lVar11) = (int)uVar8;
    }
    lVar11 = lVar11 + 0x20;
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector(&hashes_insert_copy,&hashes);
  uVar13 = (ulong)((uint)(uVar12 >> 6) & 0x7fffc000);
  uVar16 = uVar12 >> 1 & 0xffff80000;
  for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 0x20) {
    puVar1 = ((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + uVar19;
    _cVar26 = *(check_type *)(puVar1 + 8);
    puVar2 = ((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
             uVar19 + 0x10;
    e.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar2;
    e.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
    e.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 8);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&set,e);
  }
  uVar19 = (ulong)((uint)(uVar12 >> 7) & 0x3fffe000);
  uVar20 = uVar12 >> 2 & 0x7fffc0000;
  for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 0x20) {
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x9b;
    file.m_begin = (iterator)&local_120;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
    rVar6.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                   (&set,(uint256 *)
                         (((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                          _M_elems + uVar18),true);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar6.super_readonly_property<bool>.super_class_property<bool>.value;
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_178 = "set.contains(hashes[i], true)";
    local_170 = "";
    local_168.m_empty = false;
    local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_150 = &local_178;
    local_188 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_180 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,&local_168,1,0,WARN,_cVar26,(size_t)&local_188,0x9b);
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  }
  for (uVar18 = uVar13; uVar18 < uVar10; uVar18 = uVar18 + 1) {
    puVar1 = ((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
             uVar16 + 0x10;
    e_00.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar1;
    e_00.super_base_blob<256U>.m_data._M_elems._0_16_ =
         *(undefined1 (*) [16])
          (((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + uVar16);
    e_00.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 8);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&set,e_00);
    uVar16 = uVar16 + 0x20;
  }
  local_210 = 0;
  for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 0x20) {
    bVar7 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (&set,(uint256 *)
                            (((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                             _M_elems + uVar16),false);
    local_210 = local_210 + (ulong)bVar7;
  }
  lVar11 = 0;
  for (; uVar19 < uVar13; uVar19 = uVar19 + 1) {
    bVar7 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (&set,(uint256 *)
                            (((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                             _M_elems + uVar20),false);
    lVar11 = lVar11 + (ulong)bVar7;
    uVar20 = uVar20 + 0x20;
  }
  uVar12 = uVar12 >> 1 & 0xffff80000;
  lVar17 = 0;
  for (; uVar13 < uVar10; uVar13 = uVar13 + 1) {
    bVar7 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (&set,(uint256 *)
                            (((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                             _M_elems + uVar12),false);
    lVar17 = lVar17 + (ulong)bVar7;
    uVar12 = uVar12 + 0x20;
  }
  auVar21._8_4_ = (int)((ulong)lVar17 >> 0x20);
  auVar21._0_8_ = lVar17;
  auVar21._12_4_ = 0x45300000;
  hit_rate_fresh =
       ((auVar21._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) /
       ((double)(uVar9 & 0xffffffff) * 0.5);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0xb3;
  file_00.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc694e1;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1b8 = "";
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_148._1_7_ = 0x3ff00000000000;
  paVar25 = &local_148;
  pvVar14 = (iterator)0x2;
  pdVar15 = &hit_rate_fresh;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_168,&local_1c0,0xb3,1,2,pdVar15,0xb7aff1,paVar25,"1.0");
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pdVar15;
  msg_01.m_begin = pvVar14;
  file_01.m_end = (iterator)0xb6;
  file_01.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  auVar22._8_4_ = (int)((ulong)local_210 >> 0x20);
  auVar22._0_8_ = local_210;
  auVar22._12_4_ = 0x45300000;
  dVar24 = (double)(uVar9 & 0xffffffff) * 0.25;
  dVar4 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_210) - 4503599627370496.0)) / dVar24;
  auVar23._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar23._0_8_ = lVar11;
  auVar23._12_4_ = 0x45300000;
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (dVar4 + dVar4 <
       ((auVar23._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / dVar24);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178 = "hit_rate_stale > 2 * hit_rate_erased_but_contained";
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_168,1,0,WARN,(check_type)paVar25,(size_t)&local_1f0,0xb6);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&set);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&hashes.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void test_cache_erase(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;

    /** Insert the first half */
    for (uint32_t i = 0; i < (n_insert / 2); ++i)
        set.insert(hashes_insert_copy[i]);
    /** Erase the first quarter */
    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        BOOST_CHECK(set.contains(hashes[i], true));
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked as erased but are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}